

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_rc2.cc
# Opt level: O2

void RC2_cbc_encrypt(uchar *in,uchar *out,long length,RC2_KEY *ks,uchar *iv,int enc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  uint local_54;
  uint local_50;
  uint local_4c;
  uchar *local_48;
  undefined4 local_3c;
  RC2_KEY *local_38;
  
  local_48 = iv;
  if (enc == 0) {
    puVar4 = in + 7;
    uVar3 = *(uint *)(iv + 4);
    local_4c = *(uint *)iv;
    local_38 = ks;
    for (; 7 < length; length = length + -8) {
      uVar2 = *(uint *)(puVar4 + -7);
      uVar1 = *(uint *)(puVar4 + -3);
      local_54 = uVar2;
      local_50 = uVar1;
      RC2_decrypt((ulong *)&local_54,local_38);
      local_4c = local_4c ^ local_54;
      uVar3 = uVar3 ^ local_50;
      *out = (uchar)local_4c;
      out[1] = (uchar)(local_4c >> 8);
      out[2] = (uchar)(local_4c >> 0x10);
      out[3] = (uchar)(local_4c >> 0x18);
      out[4] = (uchar)uVar3;
      out[5] = (uchar)(uVar3 >> 8);
      out[6] = (uchar)(uVar3 >> 0x10);
      out[7] = (uchar)(uVar3 >> 0x18);
      out = out + 8;
      puVar4 = puVar4 + 8;
      uVar3 = uVar1;
      local_4c = uVar2;
    }
    if (length != 0) {
      local_54 = *(uint *)(puVar4 + -7);
      local_50 = *(uint *)(puVar4 + -3);
      local_3c = local_54;
      RC2_decrypt((ulong *)&local_54,local_38);
      (*(code *)(&DAT_003656ac + *(int *)(&DAT_003656ac + (length + -1) * 4)))();
      return;
    }
    *local_48 = (uchar)local_4c;
    local_48[1] = (uchar)(local_4c >> 8);
    local_48[2] = (uchar)(local_4c >> 0x10);
    local_48[3] = (uchar)(local_4c >> 0x18);
    local_48[4] = (uchar)uVar3;
    local_48[5] = (uchar)(uVar3 >> 8);
    local_48[6] = (uchar)(uVar3 >> 0x10);
    local_48[7] = (uchar)(uVar3 >> 0x18);
  }
  else {
    puVar4 = out + 7;
    uVar2 = *(uint *)(iv + 4);
    uVar3 = *(uint *)iv;
    for (; 7 < length; length = length + -8) {
      local_54 = uVar3 ^ *(uint *)in;
      local_50 = uVar2 ^ *(uint *)((long)in + 4);
      RC2_encrypt((ulong *)&local_54,ks);
      *(uint *)(puVar4 + -7) = local_54;
      *(uint *)(puVar4 + -3) = local_50;
      puVar4 = puVar4 + 8;
      in = (uchar *)((long)in + 8);
      uVar2 = local_50;
      uVar3 = local_54;
    }
    if (length != 0) {
      (*(code *)(&DAT_00365690 + *(int *)(&DAT_00365690 + (length + -1) * 4)))();
      return;
    }
    *local_48 = (uchar)uVar3;
    local_48[1] = (uchar)(uVar3 >> 8);
    local_48[2] = (uchar)(uVar3 >> 0x10);
    local_48[3] = (uchar)(uVar3 >> 0x18);
    local_48[4] = (uchar)uVar2;
    local_48[5] = (uchar)(uVar2 >> 8);
    local_48[6] = (uchar)(uVar2 >> 0x10);
    local_48[7] = (uchar)(uVar2 >> 0x18);
  }
  return;
}

Assistant:

static void RC2_cbc_encrypt(const uint8_t *in, uint8_t *out, size_t length,
                            RC2_KEY *ks, uint8_t *iv, int encrypt) {
  uint32_t tin0, tin1;
  uint32_t tout0, tout1, xor0, xor1;
  long l = length;
  uint32_t tin[2];

  if (encrypt) {
    c2l(iv, tout0);
    c2l(iv, tout1);
    iv -= 8;
    for (l -= 8; l >= 0; l -= 8) {
      c2l(in, tin0);
      c2l(in, tin1);
      tin0 ^= tout0;
      tin1 ^= tout1;
      tin[0] = tin0;
      tin[1] = tin1;
      RC2_encrypt(tin, ks);
      tout0 = tin[0];
      l2c(tout0, out);
      tout1 = tin[1];
      l2c(tout1, out);
    }
    if (l != -8) {
      c2ln(in, tin0, tin1, l + 8);
      tin0 ^= tout0;
      tin1 ^= tout1;
      tin[0] = tin0;
      tin[1] = tin1;
      RC2_encrypt(tin, ks);
      tout0 = tin[0];
      l2c(tout0, out);
      tout1 = tin[1];
      l2c(tout1, out);
    }
    l2c(tout0, iv);
    l2c(tout1, iv);
  } else {
    c2l(iv, xor0);
    c2l(iv, xor1);
    iv -= 8;
    for (l -= 8; l >= 0; l -= 8) {
      c2l(in, tin0);
      tin[0] = tin0;
      c2l(in, tin1);
      tin[1] = tin1;
      RC2_decrypt(tin, ks);
      tout0 = tin[0] ^ xor0;
      tout1 = tin[1] ^ xor1;
      l2c(tout0, out);
      l2c(tout1, out);
      xor0 = tin0;
      xor1 = tin1;
    }
    if (l != -8) {
      c2l(in, tin0);
      tin[0] = tin0;
      c2l(in, tin1);
      tin[1] = tin1;
      RC2_decrypt(tin, ks);
      tout0 = tin[0] ^ xor0;
      tout1 = tin[1] ^ xor1;
      l2cn(tout0, tout1, out, l + 8);
      xor0 = tin0;
      xor1 = tin1;
    }
    l2c(xor0, iv);
    l2c(xor1, iv);
  }
  tin[0] = tin[1] = 0;
}